

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O3

void mainchan_open_confirmation(Channel *chan)

{
  uint *mc;
  int *piVar1;
  long lVar2;
  LogContext *pLVar3;
  ChannelVtable *pCVar4;
  long *plVar5;
  _Bool _Var6;
  char cVar7;
  int iVar8;
  char *pcVar9;
  X11Display *pXVar10;
  long lVar11;
  char *key;
  char *local_30;
  
  mc = &chan[-5].initial_fixed_window_size;
  lVar2 = *(long *)&chan[-4].initial_fixed_window_size;
  (**(code **)(**(long **)(lVar2 + 0x48) + 0x48))();
  pLVar3 = *(LogContext **)(lVar2 + 0x40);
  pcVar9 = dupprintf("Opened main channel");
  logevent_and_free(pLVar3,pcVar9);
  (**(code **)(**(long **)(*(long *)&chan[-4].initial_fixed_window_size + 0x48) + 0x28))();
  if (chan[-3].field_0xc == '\x01') {
    (**(code **)(**(long **)mc + 0xa0))();
  }
  if (chan[-3].initial_fixed_window_size == 0) {
    _Var6 = conf_get_bool((Conf *)chan[-4].vt,0xaa);
    if (_Var6) {
      pcVar9 = conf_get_str((Conf *)chan[-4].vt,0xab);
      pXVar10 = x11_setup_display(pcVar9,(Conf *)chan[-4].vt,&local_30);
      if (pXVar10 == (X11Display *)0x0) {
        pLVar3 = *(LogContext **)(lVar2 + 0x40);
        pcVar9 = dupprintf("X11 forwarding not enabled: unable to initialise X display: %s",local_30
                          );
        logevent_and_free(pLVar3,pcVar9);
        safefree(local_30);
      }
      else {
        pCVar4 = chan[-3].vt;
        iVar8 = conf_get_int((Conf *)chan[-4].vt,0xac);
        lVar11 = (**(code **)(pCVar4->open_confirmation + 0x30))(pCVar4,iVar8,pXVar10);
        (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 0x50))
                  (*(long **)&chan[-5].initial_fixed_window_size,1,*(undefined8 *)(lVar11 + 0x18),
                   *(undefined8 *)(lVar11 + 0x20),pXVar10->screennum,0);
        chan[-3].field_0xd = 1;
      }
    }
    cVar7 = (**(code **)((chan[-3].vt)->open_confirmation + 0x70))();
    if (cVar7 != '\0') {
      (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 0x58))
                (*(long **)&chan[-5].initial_fixed_window_size,1);
      chan[-3].field_0xe = 1;
    }
    _Var6 = conf_get_bool((Conf *)chan[-4].vt,0x16);
    if (!_Var6) {
      (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 0x60))
                (*(long **)&chan[-5].initial_fixed_window_size,1,chan[-4].vt,
                 *(undefined4 *)((long)&chan[-1].vt + 4),chan[-1].initial_fixed_window_size);
      chan[-3].field_0xf = 1;
    }
    pcVar9 = conf_get_str_strs((Conf *)chan[-4].vt,0x38,(char *)0x0,&local_30);
    if (pcVar9 != (char *)0x0) {
      do {
        (**(code **)(**(long **)&chan[-5].initial_fixed_window_size + 0x68))
                  (*(long **)&chan[-5].initial_fixed_window_size,1,local_30,pcVar9);
        piVar1 = (int *)((long)&chan[-2].vt + 4);
        *piVar1 = *piVar1 + 1;
        pcVar9 = conf_get_str_strs((Conf *)chan[-4].vt,0x38,local_30,&local_30);
      } while (pcVar9 != (char *)0x0);
    }
    if (*(int *)((long)&chan[-2].vt + 4) != 0) {
      pLVar3 = *(LogContext **)(lVar2 + 0x40);
      pcVar9 = dupprintf("Sent %d environment variables");
      logevent_and_free(pLVar3,pcVar9);
    }
    pcVar9 = conf_get_str((Conf *)chan[-4].vt,0x14);
    _Var6 = conf_get_bool((Conf *)chan[-4].vt,0x30);
    if (_Var6) {
      cVar7 = (**(code **)(**(long **)mc + 0x80))(*(long **)mc,1,pcVar9);
      if (cVar7 == '\0') {
        mainchan_try_fallback_command((mainchan *)mc);
        return;
      }
    }
    else {
      plVar5 = *(long **)mc;
      if (*pcVar9 == '\0') {
        (**(code **)(*plVar5 + 0x70))(plVar5,1);
      }
      else {
        (**(code **)(*plVar5 + 0x78))(plVar5,1,pcVar9);
      }
    }
    *(undefined1 *)&chan[-2].vt = 1;
    return;
  }
  (**(code **)((chan[-3].vt)->open_confirmation + 0xa0))(chan[-3].vt,1,1);
  (**(code **)((chan[-3].vt)->open_confirmation + 0xa0))(chan[-3].vt,0,1);
  mainchan_ready((mainchan *)mc);
  return;
}

Assistant:

static void mainchan_open_confirmation(Channel *chan)
{
    mainchan *mc = container_of(chan, mainchan, chan);
    PacketProtocolLayer *ppl = mc->ppl; /* for ppl_logevent */

    seat_update_specials_menu(mc->ppl->seat);
    ppl_logevent("Opened main channel");
    seat_notify_session_started(mc->ppl->seat);

    if (mc->is_simple)
        sshfwd_hint_channel_is_simple(mc->sc);

    if (mc->type == MAINCHAN_SESSION) {
        /*
         * Send the CHANNEL_REQUESTS for the main session channel.
         */
        char *key, *val, *cmd;
        struct X11Display *x11disp;
        struct X11FakeAuth *x11auth;
        bool retry_cmd_now = false;

        if (conf_get_bool(mc->conf, CONF_x11_forward)) {
            char *x11_setup_err;
            if ((x11disp = x11_setup_display(
                     conf_get_str(mc->conf, CONF_x11_display),
                     mc->conf, &x11_setup_err)) == NULL) {
                ppl_logevent("X11 forwarding not enabled: unable to"
                             " initialise X display: %s", x11_setup_err);
                sfree(x11_setup_err);
            } else {
                x11auth = ssh_add_x11_display(
                    mc->cl, conf_get_int(mc->conf, CONF_x11_auth), x11disp);

                sshfwd_request_x11_forwarding(
                    mc->sc, true, x11auth->protoname, x11auth->datastring,
                    x11disp->screennum, false);
                mc->req_x11 = true;
            }
        }

        if (ssh_agent_forwarding_permitted(mc->cl)) {
            sshfwd_request_agent_forwarding(mc->sc, true);
            mc->req_agent = true;
        }

        if (!conf_get_bool(mc->conf, CONF_nopty)) {
            sshfwd_request_pty(
                mc->sc, true, mc->conf, mc->term_width, mc->term_height);
            mc->req_pty = true;
        }

        for (val = conf_get_str_strs(mc->conf, CONF_environmt, NULL, &key);
             val != NULL;
             val = conf_get_str_strs(mc->conf, CONF_environmt, key, &key)) {
            sshfwd_send_env_var(mc->sc, true, key, val);
            mc->n_req_env++;
        }
        if (mc->n_req_env)
            ppl_logevent("Sent %d environment variables", mc->n_req_env);

        cmd = conf_get_str(mc->conf, CONF_remote_cmd);
        if (conf_get_bool(mc->conf, CONF_ssh_subsys)) {
            retry_cmd_now = !sshfwd_start_subsystem(mc->sc, true, cmd);
        } else if (*cmd) {
            sshfwd_start_command(mc->sc, true, cmd);
        } else {
            sshfwd_start_shell(mc->sc, true);
        }

        if (retry_cmd_now)
            mainchan_try_fallback_command(mc);
        else
            mc->req_cmd_primary = true;

    } else {
        ssh_set_ldisc_option(mc->cl, LD_ECHO, true);
        ssh_set_ldisc_option(mc->cl, LD_EDIT, true);
        mainchan_ready(mc);
    }
}